

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int updatewindow(z_streamp strm,uint out)

{
  internal_state *piVar1;
  long lVar2;
  uint uVar3;
  z_voidpf pvVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  piVar1 = strm->state;
  lVar2._0_4_ = piVar1->gzindex;
  lVar2._4_1_ = piVar1->method;
  lVar2._5_3_ = *(undefined3 *)&piVar1->field_0x3d;
  if (lVar2 == 0) {
    pvVar4 = (*strm->zalloc)(strm->opaque,1 << ((byte)piVar1->pending & 0x1f),1);
    *(z_voidpf *)&piVar1->gzindex = pvVar4;
    if (pvVar4 == (z_voidpf)0x0) {
      return 1;
    }
  }
  if (piVar1->wrap == 0) {
    piVar1->wrap = 1 << ((byte)piVar1->pending & 0x1f);
    piVar1->gzhead = (gz_headerp)0x0;
  }
  uVar6 = out - strm->avail_out;
  uVar7 = piVar1->wrap;
  if (uVar6 < uVar7) {
    uVar5 = *(uint *)((long)&piVar1->gzhead + 4);
    uVar7 = uVar7 - uVar5;
    uVar3 = uVar6;
    if (uVar7 < uVar6) {
      uVar3 = uVar7;
    }
    memcpy((void *)((ulong)uVar5 + *(long *)&piVar1->gzindex),strm->next_out + -(ulong)uVar6,
           (ulong)uVar3);
    if (uVar6 <= uVar7) {
      uVar5 = *(int *)((long)&piVar1->gzhead + 4) + uVar3;
      uVar7 = piVar1->wrap;
      uVar6 = *(uint *)&piVar1->gzhead;
      if (uVar5 == uVar7) {
        uVar5 = 0;
      }
      *(uint *)((long)&piVar1->gzhead + 4) = uVar5;
      if (uVar7 <= uVar6) {
        return 0;
      }
      *(uint *)&piVar1->gzhead = uVar6 + uVar3;
      return 0;
    }
    uVar6 = uVar6 - uVar3;
    memcpy(*(void **)&piVar1->gzindex,strm->next_out + -(ulong)uVar6,(ulong)uVar6);
    *(uint *)((long)&piVar1->gzhead + 4) = uVar6;
  }
  else {
    memcpy(*(void **)&piVar1->gzindex,strm->next_out + -(ulong)uVar7,(ulong)uVar7);
    *(undefined4 *)((long)&piVar1->gzhead + 4) = 0;
  }
  *(int *)&piVar1->gzhead = piVar1->wrap;
  return 0;
}

Assistant:

local int updatewindow(strm, out)
z_streamp strm;
unsigned out;
{
    struct inflate_state FAR *state;
    unsigned copy, dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->write = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    copy = out - strm->avail_out;
    if (copy >= state->wsize) {
        zmemcpy(state->window, strm->next_out - state->wsize, state->wsize);
        state->write = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->write;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->write, strm->next_out - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, strm->next_out - copy, copy);
            state->write = copy;
            state->whave = state->wsize;
        }
        else {
            state->write += dist;
            if (state->write == state->wsize) state->write = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}